

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void FunctionalTester<long,_void>::Test(void)

{
  long lVar1;
  char *pcVar2;
  char local_98 [8];
  char buf2 [64];
  char buf1 [64];
  TestWatcher<long> local_9 [8];
  TestWatcher<long> tw;
  
  TestWatcher<long>::TestWatcher(local_9);
  lVar1 = std::numeric_limits<long>::min();
  int2str::convert_with_zero<long,char*>(lVar1,buf2 + 0x38);
  pcVar2 = PrintfFormat<long>();
  lVar1 = std::numeric_limits<long>::min();
  sprintf(local_98,pcVar2,lVar1);
  StrcmpAndExit(buf2 + 0x38,local_98);
  lVar1 = std::numeric_limits<long>::max();
  int2str::convert_with_zero<long,char*>(lVar1,buf2 + 0x38);
  pcVar2 = PrintfFormat<long>();
  lVar1 = std::numeric_limits<long>::max();
  sprintf(local_98,pcVar2,lVar1);
  StrcmpAndExit(buf2 + 0x38,local_98);
  TestWatcher<long>::~TestWatcher(local_9);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }